

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_world(parser *p)

{
  int iVar1;
  bool bVar2;
  level *local_20;
  level_conflict *level_find;
  level_conflict *level_check;
  parser *p_local;
  
  for (level_find = (level_conflict *)world; level_find != (level_conflict *)0x0;
      level_find = level_find->next) {
    local_20 = world;
    if (level_find->up != (char *)0x0) {
      while( true ) {
        bVar2 = false;
        if (local_20 != (level *)0x0) {
          iVar1 = strcmp(level_find->up,local_20->name);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_20 = local_20->next;
      }
      if (local_20 == (level *)0x0) {
        quit_fmt("Invalid level reference %s",level_find->up);
      }
    }
    local_20 = world;
    if (level_find->down != (char *)0x0) {
      while( true ) {
        bVar2 = false;
        if (local_20 != (level *)0x0) {
          iVar1 = strcmp(level_find->down,local_20->name);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_20 = local_20->next;
      }
      if (local_20 == (level *)0x0) {
        quit_fmt("Invalid level reference %s",level_find->down);
      }
    }
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_world(struct parser *p) {
	struct level *level_check;

	/* Check that all levels referred to exist */
	for (level_check = world; level_check; level_check = level_check->next) {
		struct level *level_find = world;

		/* Check upwards */
		if (level_check->up) {
			while (level_find && !streq(level_check->up, level_find->name)) {
				level_find = level_find->next;
			}
			if (!level_find) {
				quit_fmt("Invalid level reference %s", level_check->up);
			}
		}

		/* Check downwards */
		level_find = world;
		if (level_check->down) {
			while (level_find && !streq(level_check->down, level_find->name)) {
				level_find = level_find->next;
			}
			if (!level_find) {
				quit_fmt("Invalid level reference %s", level_check->down);
			}
		}
	}

	parser_destroy(p);
	return 0;
}